

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.h
# Opt level: O0

RetInstr * __thiscall
flow::IRBuilder::insert<flow::RetInstr,flow::Value*&>(IRBuilder *this,Value **args)

{
  Instr *pIVar1;
  unique_ptr<flow::RetInstr,_std::default_delete<flow::RetInstr>_> local_28;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> local_20;
  Value **local_18;
  Value **args_local;
  IRBuilder *this_local;
  
  local_18 = args;
  args_local = (Value **)this;
  std::make_unique<flow::RetInstr,flow::Value*>((Value **)&local_28);
  std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>::
  unique_ptr<flow::RetInstr,std::default_delete<flow::RetInstr>,void>
            ((unique_ptr<flow::Instr,std::default_delete<flow::Instr>> *)&local_20,&local_28);
  pIVar1 = insert(this,&local_20);
  std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::~unique_ptr(&local_20);
  std::unique_ptr<flow::RetInstr,_std::default_delete<flow::RetInstr>_>::~unique_ptr(&local_28);
  return (RetInstr *)pIVar1;
}

Assistant:

T* insert(Args&&... args) {
    return static_cast<T*>(insert(std::make_unique<T>(std::move(args)...)));
  }